

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O1

void Extra_SymmPairsPrint(Extra_SymmInfo_t *p)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  putchar(10);
  if (0 < p->nVars) {
    uVar4 = 1;
    lVar5 = 0;
    do {
      uVar3 = uVar4 & 0xffffffff;
      do {
        putchar(0x20);
        uVar2 = (int)uVar3 - 1;
        uVar3 = (ulong)uVar2;
      } while (uVar2 != 0);
      lVar1 = lVar5 + 1;
      uVar3 = uVar4;
      if (lVar1 < p->nVars) {
        do {
          putchar((uint)(p->pSymms[lVar5][uVar3] != '\0') * 3 + 0x2e);
          uVar3 = uVar3 + 1;
        } while ((int)uVar3 < p->nVars);
      }
      putchar(10);
      uVar4 = uVar4 + 1;
      lVar5 = lVar1;
    } while (lVar1 < p->nVars);
  }
  return;
}

Assistant:

void Extra_SymmPairsPrint( Extra_SymmInfo_t * p )
{
    int i, k;
    printf( "\n" );
    for ( i = 0; i < p->nVars; i++ )
    {
        for ( k = 0; k <= i; k++ )
            printf( " " );
        for ( k = i+1; k < p->nVars; k++ )
            if ( p->pSymms[i][k] )
                printf( "1" );
            else
                printf( "." );
        printf( "\n" );
    }
}